

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_musig_pubkey_tweak_add_internal
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,uchar *tweak32,int xonly)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  int in_R8D;
  secp256k1_scalar tweak;
  int overflow;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed0;
  int iVar2;
  secp256k1_context *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  secp256k1_ge *in_stack_ffffffffffffff68;
  int local_4;
  
  iVar2 = 0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/keyagg_impl.h"
            ,0xfc,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI != (void *)0x0) {
    memset(in_RSI,0,0x40);
  }
  if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
               (char *)in_stack_fffffffffffffec8);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
               (char *)in_stack_fffffffffffffec8);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_keyagg_cache_load
                      (in_stack_fffffffffffffed8,
                       (secp256k1_keyagg_cache_internal *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                       (secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffec8);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32
                (in_stack_fffffffffffffee0,(uchar *)in_stack_fffffffffffffed8,
                 (int *)CONCAT44(iVar2,in_stack_fffffffffffffed0));
      if (iVar2 == 0) {
        if (in_R8D != 0) {
          iVar1 = secp256k1_extrakeys_ge_even_y((secp256k1_ge *)(ulong)in_stack_fffffffffffffed0);
          if (iVar1 != 0) {
            secp256k1_scalar_negate
                      ((secp256k1_scalar *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                       (secp256k1_scalar *)in_stack_fffffffffffffec8);
          }
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                   (secp256k1_scalar *)in_stack_fffffffffffffec8,(secp256k1_scalar *)0x10a00f);
        iVar1 = secp256k1_eckey_pubkey_tweak_add
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x10a03f);
          if (iVar1 != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/keyagg_impl.h"
                    ,0x113,"test condition failed: !secp256k1_ge_is_infinity(&cache_i.pk)");
            abort();
          }
          secp256k1_keyagg_cache_save
                    ((secp256k1_musig_keyagg_cache *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
          if (in_RSI != (void *)0x0) {
            secp256k1_pubkey_save
                      ((secp256k1_pubkey *)CONCAT44(iVar2,in_stack_fffffffffffffed0),
                       &in_stack_fffffffffffffec8->pk);
          }
          local_4 = 1;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_musig_pubkey_tweak_add_internal(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *tweak32, int xonly) {
    secp256k1_keyagg_cache_internal cache_i;
    int overflow = 0;
    secp256k1_scalar tweak;

    VERIFY_CHECK(ctx != NULL);
    if (output_pubkey != NULL) {
        memset(output_pubkey, 0, sizeof(*output_pubkey));
    }
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&tweak, tweak32, &overflow);
    if (overflow) {
        return 0;
    }
    if (xonly && secp256k1_extrakeys_ge_even_y(&cache_i.pk)) {
        cache_i.parity_acc ^= 1;
        secp256k1_scalar_negate(&cache_i.tweak, &cache_i.tweak);
    }
    secp256k1_scalar_add(&cache_i.tweak, &cache_i.tweak, &tweak);
    if (!secp256k1_eckey_pubkey_tweak_add(&cache_i.pk, &tweak)) {
        return 0;
    }
    /* eckey_pubkey_tweak_add fails if cache_i.pk is infinity */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&cache_i.pk));
    secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    if (output_pubkey != NULL) {
        secp256k1_pubkey_save(output_pubkey, &cache_i.pk);
    }
    return 1;
}